

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::iterate(ErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ContextType ctxType;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    prepareFunctionPointers(this);
    bVar1 = testCreateTransformFeedbacksForInvalidNumberOfObjects(this);
    cleanErrors(this);
    bVar2 = testQueriesForInvalidNameOfObject(this);
    cleanErrors(this);
    bVar3 = testGetTransformFeedbackivQueryForInvalidParameterName(this);
    cleanErrors(this);
    bVar4 = testGetTransformFeedbacki_vQueryForInvalidParameterName(this);
    cleanErrors(this);
    bVar5 = testGetTransformFeedbacki64_vQueryForInvalidParameterName(this);
    cleanErrors(this);
    bVar6 = testIndexedQueriesForInvalidBindingPoint(this);
    cleanErrors(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		prepareFunctionPointers();

		is_ok &= testCreateTransformFeedbacksForInvalidNumberOfObjects();
		cleanErrors();

		is_ok &= testQueriesForInvalidNameOfObject();
		cleanErrors();

		is_ok &= testGetTransformFeedbackivQueryForInvalidParameterName();
		cleanErrors();

		is_ok &= testGetTransformFeedbacki_vQueryForInvalidParameterName();
		cleanErrors();

		is_ok &= testGetTransformFeedbacki64_vQueryForInvalidParameterName();
		cleanErrors();

		is_ok &= testIndexedQueriesForInvalidBindingPoint();
		cleanErrors();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}